

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.cpp
# Opt level: O0

string * GetDelimitedString_abi_cxx11_(string *__return_storage_ptr__,char **p)

{
  delim_string_t local_40;
  char **local_18;
  char **p_local;
  
  local_18 = p;
  p_local = (char **)__return_storage_ptr__;
  GetDelimitedStringEx_abi_cxx11_(&local_40,p);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_40);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EDelimiterType>
  ::~pair(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::string GetDelimitedString(char*& p) {
	return GetDelimitedStringEx(p).first;	// throw away delimiter type and return just string
}